

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

bool __thiscall QDateTimeEdit::event(QDateTimeEdit *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QDateTimeEditPrivate *opt;
  QEvent *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *unaff_retaddr;
  QDateTimeEdit *in_stack_00000008;
  bool was;
  QDateTimeEditPrivate *d;
  QString oldFormat;
  QString *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opt = d_func((QDateTimeEdit *)0x55b91f);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == ApplicationLayoutDirectionChange) {
    bVar2 = opt->formatExplicitlySet;
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
    QString::clear((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    setDisplayFormat(in_stack_00000008,unaff_retaddr);
    opt->formatExplicitlySet = (bool)(bVar2 & 1);
    QString::~QString((QString *)0x55b9eb);
  }
  else if (TVar3 == LocaleChange) {
    (**(code **)(*(long *)&(opt->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xc0))();
  }
  else if (TVar3 == StyleChange) {
    QWidgetPrivate::setLayoutItemMargins
              (in_RDI,(SubElement)((ulong)in_RSI >> 0x20),(QStyleOption *)opt);
  }
  bVar2 = QAbstractSpinBox::event((QAbstractSpinBox *)in_RSI,(QEvent *)opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QDateTimeEdit::event(QEvent *event)
{
    Q_D(QDateTimeEdit);
    switch (event->type()) {
    case QEvent::ApplicationLayoutDirectionChange: {
        const bool was = d->formatExplicitlySet;
        const QString oldFormat = d->displayFormat;
        d->displayFormat.clear();
        setDisplayFormat(oldFormat);
        d->formatExplicitlySet = was;
        break; }
    case QEvent::LocaleChange:
        d->updateEdit();
        break;
    case QEvent::StyleChange:
#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
        break;
    default:
        break;
    }
    return QAbstractSpinBox::event(event);
}